

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DeadBranchElimPass::AddBranch
          (DeadBranchElimPass *this,uint32_t labelId,BasicBlock *bp)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  DefUseManager *this_01;
  Instruction *pIVar1;
  IRContext *pIVar2;
  type pIVar3;
  Operand *local_d8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c8;
  allocator<spvtools::opt::Operand> local_bd;
  uint32_t local_bc;
  iterator local_b8;
  undefined8 local_b0;
  SmallVector<unsigned_int,_2UL> local_a8;
  Operand local_80;
  iterator local_50;
  _func_int **local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newBranch
  ;
  BasicBlock *bp_local;
  uint32_t labelId_local;
  DeadBranchElimPass *this_local;
  
  newBranch._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )bp;
  this_01 = Pass::get_def_use_mgr((Pass *)this);
  pIVar1 = analysis::DefUseManager::GetDef(this_01,labelId);
  if (pIVar1 != (Instruction *)0x0) {
    pIVar1 = (Instruction *)::operator_new(0x70);
    pIVar2 = Pass::context((Pass *)this);
    local_b8 = &local_bc;
    local_b0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_b8;
    local_bc = labelId;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,init_list);
    Operand::Operand(&local_80,SPV_OPERAND_TYPE_ID,&local_a8);
    local_50 = &local_80;
    local_48 = (_func_int **)0x1;
    std::allocator<spvtools::opt::Operand>::allocator(&local_bd);
    __l._M_len = (size_type)local_48;
    __l._M_array = local_50;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_40,__l,&local_bd);
    opt::Instruction::Instruction(pIVar1,pIVar2,OpBranch,0,0,&local_40);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_28,pIVar1);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_bd);
    local_d8 = (Operand *)&local_50;
    do {
      local_d8 = local_d8 + -1;
      Operand::~Operand(local_d8);
    } while (local_d8 != &local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator*(&local_28);
    IRContext::AnalyzeDefUse(pIVar2,pIVar3);
    pIVar2 = Pass::context((Pass *)this);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator*(&local_28);
    IRContext::set_instr_block
              (pIVar2,pIVar3,
               (BasicBlock *)
               newBranch._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
    this_00 = newBranch;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    unique_ptr(&local_c8,&local_28);
    BasicBlock::AddInstruction
              ((BasicBlock *)
               this_00._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,&local_c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_28);
    return;
  }
  __assert_fail("get_def_use_mgr()->GetDef(labelId) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                ,0x4e,"void spvtools::opt::DeadBranchElimPass::AddBranch(uint32_t, BasicBlock *)");
}

Assistant:

void DeadBranchElimPass::AddBranch(uint32_t labelId, BasicBlock* bp) {
  assert(get_def_use_mgr()->GetDef(labelId) != nullptr);
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranch, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {labelId}}}));
  context()->AnalyzeDefUse(&*newBranch);
  context()->set_instr_block(&*newBranch, bp);
  bp->AddInstruction(std::move(newBranch));
}